

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetainfoSet.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
ser::MetainfoSet::types(vector<int,_std::allocator<int>_> *__return_storage_ptr__,MetainfoSet *this)

{
  _Rb_tree_node_base *operand;
  char *pcVar1;
  pointer pcVar2;
  int iVar3;
  undefined *puVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  iterator iVar8;
  undefined1 *local_58;
  int local_50;
  undefined1 local_48 [20];
  int local_34;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (__return_storage_ptr__,(this->data_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var6 = (this->data_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var6 == &(this->data_)._M_t._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    puVar4 = &void::typeinfo;
    if (*(long **)(p_Var6 + 2) != (long *)0x0) {
      puVar4 = (undefined *)(**(code **)(**(long **)(p_Var6 + 2) + 0x10))();
    }
    pcVar1 = *(char **)(puVar4 + 8);
    if ((pcVar1 == _ofstream) ||
       ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,_ofstream), iVar3 == 0)))) {
      local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xffffffff);
      iVar8._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar8._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar8,(int *)&local_58);
      }
      else {
        *iVar8._M_current = -1;
LAB_00119146:
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar8._M_current + 1;
      }
    }
    else {
      operand = p_Var6 + 2;
      puVar4 = &void::typeinfo;
      if (*(placeholder **)operand != (placeholder *)0x0) {
        iVar3 = (*(*(placeholder **)operand)->_vptr_placeholder[2])();
        puVar4 = (undefined *)CONCAT44(extraout_var,iVar3);
      }
      pcVar1 = *(char **)(puVar4 + 8);
      if ((pcVar1 == _put) || ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,_put), iVar3 == 0)))) {
        local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xfffffffe);
        iVar8._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar8._M_current !=
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          *iVar8._M_current = -2;
          goto LAB_00119146;
        }
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (__return_storage_ptr__,iVar8,(int *)&local_58);
      }
      else {
        puVar4 = &void::typeinfo;
        if (*(placeholder **)operand != (placeholder *)0x0) {
          iVar3 = (*(*(placeholder **)operand)->_vptr_placeholder[2])();
          puVar4 = (undefined *)CONCAT44(extraout_var_00,iVar3);
        }
        pcVar1 = *(char **)(puVar4 + 8);
        if ((pcVar1 == ___throw_out_of_range_fmt) ||
           ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,___throw_out_of_range_fmt), iVar3 == 0)))) {
          local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xfffffffd);
          iVar8._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current !=
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            *iVar8._M_current = -3;
            goto LAB_00119146;
          }
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,iVar8,(int *)&local_58);
        }
        else {
          puVar4 = &void::typeinfo;
          if (*(placeholder **)operand != (placeholder *)0x0) {
            iVar3 = (*(*(placeholder **)operand)->_vptr_placeholder[2])();
            puVar4 = (undefined *)CONCAT44(extraout_var_01,iVar3);
          }
          pcVar1 = *(char **)(puVar4 + 8);
          if ((pcVar1 == __M_extract<float>) ||
             ((*pcVar1 != '*' && (iVar3 = strcmp(pcVar1,__M_extract<float>), iVar3 == 0)))) {
            local_58 = (undefined1 *)CONCAT44(local_58._4_4_,0xfffffffc);
            iVar8._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current !=
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *iVar8._M_current = -4;
              goto LAB_00119146;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (__return_storage_ptr__,iVar8,(int *)&local_58);
          }
          else {
            puVar4 = &void::typeinfo;
            if (*(placeholder **)operand != (placeholder *)0x0) {
              iVar3 = (*(*(placeholder **)operand)->_vptr_placeholder[2])();
              puVar4 = (undefined *)CONCAT44(extraout_var_02,iVar3);
            }
            pcVar1 = *(char **)(puVar4 + 8);
            if ((pcVar1 != "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") &&
               ((*pcVar1 == '*' ||
                (iVar3 = strcmp(pcVar1,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
                iVar3 != 0)))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Error: type of metainfo ",0x18);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,*(char **)(p_Var6 + 1),
                                  (long)p_Var6[1]._M_parent);
              std::operator<<(poVar7," is not supported\n");
              exit(1);
            }
            pbVar5 = boost::any_cast<std::__cxx11::string_const&>((any *)operand);
            local_58 = local_48;
            pcVar2 = (pbVar5->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,pcVar2,pcVar2 + pbVar5->_M_string_length);
            local_34 = local_50;
            iVar8._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar8._M_current ==
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (__return_storage_ptr__,iVar8,&local_34);
            }
            else {
              *iVar8._M_current = local_50;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar8._M_current + 1;
            }
            if (local_58 != local_48) {
              operator_delete(local_58);
            }
          }
        }
      }
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  } while( true );
}

Assistant:

std::vector<int> MetainfoSet::types() const
{
    std::vector<int> ret;
    ret.reserve(data_.size());
    for (std::map<std::string, boost::any>::const_iterator iter = data_.begin(); iter != data_.end(); ++iter)
    {
        if (iter->second.type() == typeid(bool))
            ret.push_back(-1);
        else if (iter->second.type() == typeid(int))
            ret.push_back(-2);
        else if (iter->second.type() == typeid(float))
            ret.push_back(-3);
        else if (iter->second.type() == typeid(double))
            ret.push_back(-4);
        else if (iter->second.type() == typeid(std::string))
            ret.push_back(boost::any_cast<std::string>(iter->second).size());
        else
        {
            std::cout << "Error: type of metainfo " << iter->first << " is not supported\n";
            std::exit(1);
        }
    }
    return ret;
}